

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder **ppSVar1;
  short sVar2;
  ushort uVar3;
  StructPointerCount SVar4;
  CapTableReader *pCVar5;
  ReadLimiter *pRVar6;
  word *pwVar7;
  Arena *pAVar8;
  size_t sVar9;
  undefined6 uVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  ulong uVar13;
  undefined4 extraout_var_00;
  SegmentReader **ppSVar14;
  ElementSize EVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  char *pcVar19;
  char *macroArgs;
  ulong uVar20;
  SegmentBuilder **ppSVar21;
  SegmentBuilder **ppSVar22;
  OrphanBuilder *pOVar23;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *pDVar24;
  bool bVar25;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentBuilder *local_50;
  Fault f_2;
  WirePointerCount expectedPointersPerElement;
  uint pointerCount;
  BitCount expectedDataBitsPerElement;
  
  local_50 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  ppSVar22 = (SegmentBuilder **)this->location;
  uVar12 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar12 == 0) goto LAB_0017f9d9;
  pOVar23 = this;
  if ((uVar12 & 3) == 2 && local_50 != (SegmentBuilder *)0x0) {
    iVar11 = (*((local_50->super_SegmentReader).arena)->_vptr_Arena[2])();
    local_50 = (SegmentBuilder *)CONCAT44(extraout_var,iVar11);
    _kjCondition.left = (SegmentReader **)&local_50;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_50 != (SegmentBuilder *)0x0;
    if (local_50 == (SegmentBuilder *)0x0) {
      pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)pDVar24,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar12 = (uint)(this->tag).content;
      uVar20 = (ulong)(uVar12 >> 3);
      uVar13 = (local_50->super_SegmentReader).ptr.size_;
      if ((long)uVar13 < (long)uVar20) {
        uVar20 = uVar13;
      }
      uVar16 = 2 - (ulong)((uVar12 & 4) == 0);
      if (uVar16 + uVar20 <= uVar13) {
        pOVar23 = (OrphanBuilder *)((local_50->super_SegmentReader).ptr.ptr + uVar20);
        pRVar6 = (local_50->super_SegmentReader).readLimiter;
        uVar13 = pRVar6->limit;
        if (uVar16 <= uVar13) {
          pRVar6->limit = uVar13 - uVar16;
          if (((this->tag).content & 4) != 0) {
            pAVar8 = (local_50->super_SegmentReader).arena;
            iVar11 = (*pAVar8->_vptr_Arena[2])
                               (pAVar8,(ulong)*(uint *)((long)&(pOVar23->tag).content + 4));
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar11);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
            if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0017ff26:
              ppSVar22 = (SegmentBuilder **)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
            }
            else {
              uVar12 = (uint)(pOVar23->tag).content & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar12);
              _kjCondition.right = anon_var_dwarf_48c59;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar12 == 2);
              if (uVar12 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_0017ff26;
              }
              uVar13 = (ulong)((uint)(pOVar23->tag).content >> 3);
              sVar9 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
              if ((long)sVar9 < (long)uVar13) {
                uVar13 = sVar9;
              }
              ppSVar22 = (SegmentBuilder **)
                         ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar13);
              local_50 = (SegmentBuilder *)newSegment;
            }
            pOVar23 = (OrphanBuilder *)&pOVar23->segment;
            goto LAB_0017f8aa;
          }
          ppSVar1 = &pOVar23->segment;
          uVar12 = (uint)(pOVar23->tag).content;
          lVar18 = (long)((int)uVar12 >> 2);
          ppSVar21 = ppSVar1 + lVar18;
          if ((local_50 != (SegmentBuilder *)0x0) &&
             ((pwVar7 = (local_50->super_SegmentReader).ptr.ptr,
              ppSVar22 = (SegmentBuilder **)(pwVar7 + (local_50->super_SegmentReader).ptr.size_),
              lVar18 < (long)pwVar7 - (long)ppSVar1 >> 3 ||
              ((long)ppSVar22 - (long)ppSVar1 >> 3 < lVar18)))) goto LAB_0017f8aa;
          goto LAB_0017f8b7;
        }
        (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      pDVar24 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)pDVar24,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  else {
LAB_0017f8aa:
    if (ppSVar22 == (SegmentBuilder **)0x0) goto LAB_0017f9d9;
    uVar12 = (uint)(pOVar23->tag).content;
    ppSVar21 = ppSVar22;
LAB_0017f8b7:
    uVar12 = uVar12 & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar12);
    _kjCondition.right = anon_var_dwarf_48c59;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar12 == 1);
    if (uVar12 == 1) {
      uVar12 = *(uint *)((long)&(pOVar23->tag).content + 4);
      EVar15 = (ElementSize)uVar12 & INLINE_COMPOSITE;
      if (EVar15 == INLINE_COMPOSITE) {
        f_2.exception._0_4_ = uVar12 >> 3;
        if (local_50 != (SegmentBuilder *)0x0) {
          if (((long)ppSVar21 - (long)(local_50->super_SegmentReader).ptr.ptr >> 3) +
              (ulong)(uint)f_2.exception + 1 <= (local_50->super_SegmentReader).ptr.size_) {
            uVar13 = (ulong)(uint)f_2.exception + 1;
            pRVar6 = (local_50->super_SegmentReader).readLimiter;
            uVar20 = pRVar6->limit;
            if (uVar13 <= uVar20) {
              pRVar6->limit = uVar20 - uVar13;
              goto LAB_0017fbd6;
            }
            (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          pcVar19 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
          iVar11 = 0x900;
          goto LAB_0017fb11;
        }
LAB_0017fbd6:
        bVar25 = (*(uint *)ppSVar21 & 3) == 0;
        _kjCondition.left = (SegmentReader **)((ulong)*(uint *)ppSVar21 & 0xffffffff00000003);
        _kjCondition.right = anon_var_dwarf_48c59;
        _kjCondition.op.content.ptr = (char *)0x5;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar25);
        if (!bVar25) {
          pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                    ((Fault *)pDVar24,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      &_kjCondition,
                     (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
          goto LAB_0017ffab;
        }
        uVar12 = *(uint *)ppSVar21 >> 2 & 0x1fffffff;
        uVar13 = (ulong)uVar12;
        uVar17 = (uint)*(ushort *)((long)ppSVar21 + 6) + (uint)*(ushort *)((long)ppSVar21 + 4);
        _kjCondition.left = (SegmentReader **)(uVar17 * uVar13);
        _kjCondition.right = &f_2;
        _kjCondition.op.content.ptr = " <= ";
        ppSVar14 = (SegmentReader **)(ulong)(uint)f_2.exception;
        _kjCondition.op.content.size_ = 5;
        bVar25 = (long)_kjCondition.left - (long)ppSVar14 == 0;
        _kjCondition.result = _kjCondition.left < ppSVar14 || bVar25;
        if (_kjCondition.left >= ppSVar14 && !bVar25) {
          pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                    ((Fault *)pDVar24,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                     "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                     (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                     (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
          goto LAB_0017ffab;
        }
        if ((uVar17 == 0) && (local_50 != (SegmentBuilder *)0x0)) {
          pRVar6 = (local_50->super_SegmentReader).readLimiter;
          uVar20 = pRVar6->limit;
          if (uVar20 < uVar13) {
            (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
            pcVar19 = "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))";
            iVar11 = 0x917;
            goto LAB_00180106;
          }
          pRVar6->limit = uVar20 - uVar13;
        }
        uVar10 = (undefined6)((ulong)_kjCondition.left >> 0x10);
        if (elementSize - 2 < 4) {
          sVar2 = *(short *)((long)ppSVar21 + 4);
          _kjCondition.left = (SegmentReader **)(CONCAT62(uVar10,sVar2) & 0xffffffff);
          _kjCondition.right = anon_var_dwarf_d05b;
          _kjCondition.op.content.ptr = (char *)0x4;
          _kjCondition.op.content.size_ = (size_t)(sVar2 != 0);
          if (sVar2 == 0) {
            pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                      ((Fault *)pDVar24,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                       "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                       ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                       (char (*) [84])
                       "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                      );
            goto LAB_0017ffab;
          }
        }
        else if (elementSize == POINTER) {
          sVar2 = *(short *)((long)ppSVar21 + 6);
          _kjCondition.left = (SegmentReader **)(CONCAT62(uVar10,sVar2) & 0xffffffff);
          _kjCondition.right = anon_var_dwarf_d05b;
          _kjCondition.op.content.ptr = (char *)0x4;
          _kjCondition.op.content.size_ = (size_t)(sVar2 != 0);
          if (sVar2 == 0) {
            pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                      ((Fault *)pDVar24,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                       "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                       ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                       (char (*) [79])
                       "Schema mismatch: Expected a pointer list, but got a list of data-only structs."
                      );
            goto LAB_0017ffab;
          }
        }
        else if (elementSize == BIT) {
          pcVar19 = 
          "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
          ;
          macroArgs = 
          "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
          ;
          iVar11 = 0x92a;
          goto LAB_0017fc93;
        }
        uVar3 = *(ushort *)((long)ppSVar21 + 4);
        SVar4 = *(StructPointerCount *)((long)ppSVar21 + 6);
        __return_storage_ptr__->segment = &local_50->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar5;
        __return_storage_ptr__->ptr = (byte *)(ppSVar21 + 1);
        __return_storage_ptr__->elementCount = uVar12;
        __return_storage_ptr__->step = uVar17 * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar3 << 6;
        __return_storage_ptr__->structPointerCount = SVar4;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_00180063:
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        iVar11 = 1;
      }
      else {
        f_2.exception._0_4_ = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar12 & 7) * 4);
        pointerCount = (uint)(EVar15 == POINTER);
        uVar13 = (ulong)(uVar12 >> 3);
        uVar17 = pointerCount * 0x40 + (uint)f_2.exception;
        if (local_50 == (SegmentBuilder *)0x0) {
LAB_0017fc52:
          if ((uVar12 & 7) == 0) {
            if (local_50 != (SegmentBuilder *)0x0) {
              pRVar6 = (local_50->super_SegmentReader).readLimiter;
              uVar20 = pRVar6->limit;
              if (uVar20 < uVar13) {
                (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
                pcVar19 = "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))";
                iVar11 = 0x960;
LAB_00180106:
                newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
                pDVar24 = &_kjCondition;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                          ((Fault *)&_kjCondition,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,iVar11,FAILED,pcVar19,
                           "_kjCondition,\"Message contains amplified list pointer.\"",
                           (DebugExpression<bool> *)&newSegment,
                           (char (*) [41])"Message contains amplified list pointer.");
                goto LAB_0017ffab;
              }
              pRVar6->limit = uVar20 - uVar13;
            }
LAB_0017fdfd:
            expectedDataBitsPerElement =
                 *(BitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4);
            _kjCondition.left = (SegmentReader **)&expectedDataBitsPerElement;
            expectedPointersPerElement = (WirePointerCount)(elementSize == POINTER);
            _kjCondition.right = &f_2;
            _kjCondition.result = expectedDataBitsPerElement <= (uint)f_2.exception;
            if ((uint)f_2.exception < expectedDataBitsPerElement) {
              pcVar19 = "expectedDataBitsPerElement <= dataSize";
              iVar11 = 0x979;
            }
            else {
              _kjCondition.result = EVar15 == POINTER || elementSize != POINTER;
              _kjCondition.left = (SegmentReader **)&expectedPointersPerElement;
              _kjCondition.right = &pointerCount;
              if (EVar15 == POINTER || elementSize != POINTER) {
                __return_storage_ptr__->segment = &local_50->super_SegmentReader;
                __return_storage_ptr__->capTable = pCVar5;
                __return_storage_ptr__->ptr = (byte *)ppSVar21;
                __return_storage_ptr__->elementCount = uVar12 >> 3;
                __return_storage_ptr__->step = uVar17;
                __return_storage_ptr__->structDataSize = (uint)f_2.exception;
                __return_storage_ptr__->structPointerCount = (ushort)(EVar15 == POINTER);
                __return_storage_ptr__->elementSize = EVar15;
                goto LAB_00180063;
              }
              pcVar19 = "expectedPointersPerElement <= pointerCount";
              iVar11 = 0x97d;
            }
            _kjCondition.op.content.size_ = 5;
            _kjCondition.op.content.ptr = " <= ";
            pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                      ((Fault *)&newSegment,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar11,FAILED,pcVar19,
                       "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                       (char (*) [72])
                       "Schema mismatch: Message contained list with incompatible element type.");
          }
          else {
            if ((elementSize == BIT) || (EVar15 != BIT)) goto LAB_0017fdfd;
            pcVar19 = 
            "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
            ;
            macroArgs = 
            "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
            ;
            iVar11 = 0x969;
LAB_0017fc93:
            pDVar24 = &_kjCondition;
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar11,FAILED,(char *)0x0,macroArgs,(char (*) [106])(pcVar19 + 0x11));
          }
          goto LAB_0017ffab;
        }
        uVar20 = uVar17 * uVar13 + 0x3f >> 6 & 0xffffffff;
        if (((long)ppSVar21 - (long)(local_50->super_SegmentReader).ptr.ptr >> 3) + uVar20 <=
            (local_50->super_SegmentReader).ptr.size_) {
          pRVar6 = (local_50->super_SegmentReader).readLimiter;
          uVar16 = pRVar6->limit;
          if (uVar20 <= uVar16) {
            pRVar6->limit = uVar16 - uVar20;
            goto LAB_0017fc52;
          }
          (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        pcVar19 = "boundsCheck(segment, ptr, wordCount)";
        iVar11 = 0x958;
LAB_0017fb11:
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        pDVar24 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,iVar11,FAILED,pcVar19,
                   "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [319])
                   "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
LAB_0017ffab:
        kj::_::Debug::Fault::~Fault((Fault *)pDVar24);
        iVar11 = 2;
      }
      if (iVar11 != 2) {
        return __return_storage_ptr__;
      }
      goto LAB_0017f9d9;
    }
    pDVar24 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
              ((Fault *)pDVar24,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
               ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                &_kjCondition,
               (char (*) [84])
               "Schema mismatch: Message contains non-list pointer where list pointer was expected."
              );
  }
  kj::_::Debug::Fault::~Fault((Fault *)pDVar24);
LAB_0017f9d9:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  __return_storage_ptr__->elementSize = elementSize;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}